

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O3

bool __thiscall
XmlModelSerialiserPrivate::readXml(XmlModelSerialiserPrivate *this,QXmlStreamReader *reader)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  bool bVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  undefined1 auVar28 [16];
  QVariant roleVariant;
  QXmlStreamAttributes headDataAttribute;
  undefined1 local_a0 [36];
  uint local_7c;
  QArrayDataPointer<QXmlStreamAttribute> local_78;
  QString local_60;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_model;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
LAB_0012bdbd:
    bVar11 = false;
  }
  else {
    local_a0._0_8_ = -NAN;
    local_a0._8_8_ = 0;
    local_a0._16_8_ = (QAbstractItemModel *)0x0;
    uVar6 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_a0);
    local_78.d = (Data *)0xffffffffffffffff;
    local_78.ptr = (QXmlStreamAttribute *)0x0;
    local_78.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar6,&local_78);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    local_a0._0_8_ = (QArrayData *)0xffffffffffffffff;
    local_a0._8_8_ = (char16_t *)0x0;
    local_a0._16_8_ = (QAbstractItemModel *)0x0;
    uVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_a0);
    local_78.d = (Data *)0xffffffffffffffff;
    local_78.ptr = (QXmlStreamAttribute *)0x0;
    local_78.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar6,&local_78);
    cVar2 = QXmlStreamReader::atEnd();
    if (cVar2 == '\0') {
      bVar4 = 0;
      bVar11 = false;
      uVar8 = 0;
      do {
        iVar7 = QXmlStreamReader::error();
        if (iVar7 != 0) break;
        QXmlStreamReader::readNext();
        iVar7 = QXmlStreamReader::tokenType();
        if (iVar7 == 4) {
          auVar28 = QXmlStreamReader::name();
          if ((auVar28._0_8_ == 7) &&
             (QVar12.m_data = auVar28._8_8_, QVar12.m_size = 7, QVar20.m_data = L"Element",
             QVar20.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar12,QVar20), cVar2 != '\0')) {
            local_a0._0_8_ = (QArrayData *)0xffffffffffffffff;
            local_a0._8_8_ = (char16_t *)0x0;
            local_a0._16_8_ = (QAbstractItemModel *)0x0;
            bVar3 = readXmlElement(this,reader,(QModelIndex *)local_a0);
            if (!bVar3) goto LAB_0012bd1a;
          }
          else {
            auVar28 = QXmlStreamReader::name();
            if ((auVar28._0_8_ == 10) &&
               (QVar13.m_data = auVar28._8_8_, QVar13.m_size = 10, QVar22.m_data = L"HeaderData",
               QVar22.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar13,QVar22), cVar2 != '\0')) {
              bVar4 = 1;
            }
            else {
              auVar28 = QXmlStreamReader::name();
              if ((auVar28._0_8_ == 8) &&
                 (QVar14.m_data = auVar28._8_8_, QVar14.m_size = 8, QVar23.m_data = L"Vertical",
                 QVar23.m_size = 8, bVar5 = QtPrivate::equalStrings(QVar14,QVar23),
                 (bVar5 & bVar4) == 1)) {
                uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
                if (bVar11) goto LAB_0012bdbd;
              }
              else {
                auVar28 = QXmlStreamReader::name();
                if ((auVar28._0_8_ == 10) &&
                   (QVar15.m_data = auVar28._8_8_, QVar15.m_size = 10, QVar24.m_data = L"Horizontal"
                   , QVar24.m_size = 10, bVar5 = QtPrivate::equalStrings(QVar15,QVar24),
                   (bVar5 & bVar4) == 1)) {
                  bVar11 = true;
                  if ((uVar8 & 1) != 0) goto LAB_0012bdbd;
                }
                else {
                  auVar28 = QXmlStreamReader::name();
                  if ((auVar28._0_8_ == 0xf) &&
                     (QVar17.m_data = auVar28._8_8_, QVar17.m_size = 0xf,
                     QVar26.m_data = L"HeaderDataPoint", QVar26.m_size = 0xf,
                     bVar5 = QtPrivate::equalStrings(QVar17,QVar26), (bVar5 & bVar4) == 1)) {
                    if (((uVar8 & 1) == 0) && (!bVar11)) goto LAB_0012bdbd;
                    QXmlStreamReader::attributes();
                    local_a0._0_8_ = (QArrayData *)0x0;
                    local_a0._8_8_ = L"Section";
                    local_a0._16_8_ = (QAbstractItemModel *)0x7;
                    QXmlStreamAttributes::value((QString *)&local_78);
                    local_7c = (uint)uVar8;
                    if (extraout_RDX == 0) {
                      bVar3 = false;
                    }
                    else {
                      local_60.d.d = (Data *)0x0;
                      local_60.d.ptr = L"Role";
                      local_60.d.size = 4;
                      QXmlStreamAttributes::value((QString *)&local_78);
                      if (extraout_RDX_00 == 0) {
                        bVar3 = false;
                      }
                      else {
                        local_48 = (QArrayData *)0x0;
                        local_40 = L"Type";
                        local_38 = 4;
                        QXmlStreamAttributes::value((QString *)&local_78);
                        bVar3 = extraout_RDX_01 != 0;
                        if (local_48 != (QArrayData *)0x0) {
                          LOCK();
                          (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
                               (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(local_48,2,8);
                          }
                        }
                      }
                      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_60.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_60.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
                        }
                      }
                    }
                    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_a0._0_8_ = *(int *)local_a0._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_a0._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,8);
                      }
                    }
                    if (!bVar3) {
                      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_78);
                      goto LAB_0012bdbd;
                    }
                    local_a0._0_8_ = (QArrayData *)0x0;
                    local_a0._8_8_ = L"Section";
                    local_a0._16_8_ = (QAbstractItemModel *)0x7;
                    QVar19 = (QStringView)QXmlStreamAttributes::value((QString *)&local_78);
                    uVar8 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
                    if ((long)(int)uVar8 != uVar8) {
                      uVar8 = 0;
                    }
                    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_a0._0_8_ = *(int *)local_a0._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_a0._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,8);
                      }
                    }
                    local_a0._0_8_ = (QArrayData *)0x0;
                    local_a0._8_8_ = L"Role";
                    local_a0._16_8_ = (QAbstractItemModel *)0x4;
                    QVar19 = (QStringView)QXmlStreamAttributes::value((QString *)&local_78);
                    uVar9 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
                    if ((long)(int)uVar9 != uVar9) {
                      uVar9 = 0;
                    }
                    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_a0._0_8_ = *(int *)local_a0._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_a0._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,8);
                      }
                    }
                    local_a0._0_8_ = (QArrayData *)0x0;
                    local_a0._8_8_ = L"Type";
                    local_a0._16_8_ = (QAbstractItemModel *)0x4;
                    QVar19 = (QStringView)QXmlStreamAttributes::value((QString *)&local_78);
                    lVar10 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
                    if ((int)lVar10 != lVar10) {
                      lVar10 = 0;
                    }
                    if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_a0._0_8_ = *(int *)local_a0._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_a0._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,8);
                      }
                    }
                    QXmlStreamReader::readElementText(&local_60,reader,0);
                    AbstractStringSerialiserPrivate::loadVariant
                              ((QVariant *)local_a0,&this->super_AbstractStringSerialiserPrivate,
                               (int)lVar10,&local_60);
                    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_60.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
                      }
                    }
                    cVar2 = ::QVariant::isNull();
                    if (cVar2 == '\0') {
                      pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                               super_AbstractModelSerialiserPrivate.m_model;
                      (**(code **)(*(long *)pQVar1 + 0xa8))
                                (pQVar1,uVar8 & 0xffffffff,(local_7c & 1) + 1,local_a0,
                                 uVar9 & 0xffffffff);
                    }
                    ::QVariant::~QVariant((QVariant *)local_a0);
                    QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_78);
                    uVar8 = (ulong)local_7c;
                  }
                }
              }
            }
          }
        }
        else {
          iVar7 = QXmlStreamReader::tokenType();
          if (iVar7 == 5) {
            auVar28 = QXmlStreamReader::name();
            if ((auVar28._0_8_ == 10) &&
               (QVar19.m_data = auVar28._8_8_, QVar19.m_size = 10, QVar21.m_data = L"HeaderData",
               QVar21.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar19,QVar21), cVar2 != '\0')) {
              bVar4 = 0;
            }
            else {
              auVar28 = QXmlStreamReader::name();
              if ((auVar28._0_8_ == 8) &&
                 (QVar16.m_data = auVar28._8_8_, QVar16.m_size = 8, QVar25.m_data = L"Vertical",
                 QVar25.m_size = 8, bVar5 = QtPrivate::equalStrings(QVar16,QVar25),
                 (bVar4 & bVar5) != 0)) {
                uVar8 = 0;
              }
              else {
                auVar28 = QXmlStreamReader::name();
                if ((auVar28._0_8_ == 10) &&
                   (QVar18.m_data = auVar28._8_8_, QVar18.m_size = 10, QVar27.m_data = L"Horizontal"
                   , QVar27.m_size = 10, bVar5 = QtPrivate::equalStrings(QVar18,QVar27),
                   (bVar4 & bVar5) != 0)) {
                  bVar11 = false;
                }
              }
            }
          }
        }
        cVar2 = QXmlStreamReader::atEnd();
      } while (cVar2 == '\0');
    }
    iVar7 = QXmlStreamReader::error();
    if (iVar7 == 0) {
      bVar11 = true;
    }
    else {
LAB_0012bd1a:
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_model;
      local_a0._0_8_ = -NAN;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = (QAbstractItemModel *)0x0;
      uVar6 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_a0);
      local_78.d = (Data *)0xffffffffffffffff;
      local_78.ptr = (QXmlStreamAttribute *)0x0;
      local_78.size = 0;
      bVar11 = false;
      (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar6,&local_78);
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_model;
      local_a0._0_8_ = -NAN;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = (QAbstractItemModel *)0x0;
      uVar6 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_a0);
      local_78.d = (Data *)0xffffffffffffffff;
      local_78.ptr = (QXmlStreamAttribute *)0x0;
      local_78.size = 0;
      (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar6,&local_78);
    }
  }
  return bVar11;
}

Assistant:

bool XmlModelSerialiserPrivate::readXml(QXmlStreamReader &reader)
{
    if (!m_model)
        return false;
    m_model->removeColumns(0, m_model->columnCount());
    m_model->removeRows(0, m_model->rowCount());
    bool headerDataStarted = false;
    bool hHeaderDataStarted = false;
    bool vHeaderDataStarted = false;
    while (!reader.atEnd() && !reader.hasError()) {
        reader.readNext();
        if (reader.isStartElement()) {
            if (reader.name() == QStringLiteral("Element")) {
                if (!readXmlElement(reader)) {
                    m_model->removeColumns(0, m_model->columnCount());
                    m_model->removeRows(0, m_model->rowCount());
                    return false;
                }
            } else if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = true;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                if (hHeaderDataStarted)
                    return false;
                vHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                if (vHeaderDataStarted)
                    return false;
                hHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("HeaderDataPoint") && headerDataStarted) {
                if (!(vHeaderDataStarted || hHeaderDataStarted))
                    return false;
                const QXmlStreamAttributes headDataAttribute = reader.attributes();
                if (!(headDataAttribute.hasAttribute(QStringLiteral("Section")) && headDataAttribute.hasAttribute(QStringLiteral("Role"))
                      && headDataAttribute.hasAttribute(QStringLiteral("Type"))))
                    return false;
                int headerSection = headDataAttribute.value(QStringLiteral("Section")).toInt();
                int headerRole = headDataAttribute.value(QStringLiteral("Role")).toInt();
                int headerType = headDataAttribute.value(QStringLiteral("Type")).toInt();
                const QVariant roleVariant = loadVariant(headerType, reader.readElementText());
                if (!roleVariant.isNull()) // skip unhandled types
                    m_model->setHeaderData(headerSection, (vHeaderDataStarted ? Qt::Vertical : Qt::Horizontal), roleVariant, headerRole);
            }

        } else if (reader.isEndElement()) {
            if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = false;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                vHeaderDataStarted = false;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                hHeaderDataStarted = false;
            }
        }
    }
    if (reader.hasError()) {
        m_model->removeColumns(0, m_model->columnCount());
        m_model->removeRows(0, m_model->rowCount());
        return false;
    }
    return true;
}